

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_batch_collector.cpp
# Opt level: O2

SinkNextBatchType __thiscall
duckdb::PhysicalBufferedBatchCollector::NextBatch
          (PhysicalBufferedBatchCollector *this,ExecutionContext *context,
          OperatorSinkNextBatchInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  _func_int **batch;
  idx_t min_batch_index;
  _func_int **pp_Var3;
  BufferedData *this_00;
  BatchedBufferedData *this_01;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  batch = pLVar2[1]._vptr_LocalSinkState;
  min_batch_index = optional_idx::GetIndex(&(pLVar2->partition_info).min_batch_index);
  pp_Var3 = (_func_int **)optional_idx::GetIndex(&(pLVar2->partition_info).batch_index);
  this_00 = shared_ptr<duckdb::BufferedData,_true>::operator->
                      ((shared_ptr<duckdb::BufferedData,_true> *)
                       &pGVar1[1].super_StateWithBlockableTasks.lock);
  this_01 = BufferedData::Cast<duckdb::BatchedBufferedData>(this_00);
  BatchedBufferedData::CompleteBatch(this_01,(idx_t)batch);
  pLVar2[1]._vptr_LocalSinkState = pp_Var3;
  BatchedBufferedData::UpdateMinBatchIndex(this_01,min_batch_index);
  return READY;
}

Assistant:

SinkNextBatchType PhysicalBufferedBatchCollector::NextBatch(ExecutionContext &context,
                                                            OperatorSinkNextBatchInput &input) const {

	auto &gstate = input.global_state.Cast<BufferedBatchCollectorGlobalState>();
	auto &lstate = input.local_state.Cast<BufferedBatchCollectorLocalState>();

	auto batch = lstate.current_batch;
	auto min_batch_index = lstate.partition_info.min_batch_index.GetIndex();
	auto new_index = lstate.partition_info.batch_index.GetIndex();

	auto &buffered_data = gstate.buffered_data->Cast<BatchedBufferedData>();
	buffered_data.CompleteBatch(batch);
	lstate.current_batch = new_index;
	// FIXME: this can move from the buffer to the read queue, increasing the 'read_queue_byte_count'
	// We might want to block here if 'read_queue_byte_count' has already reached the ReadQueueCapacity()
	// So we don't completely disregard the 'streaming_buffer_size' that was set
	buffered_data.UpdateMinBatchIndex(min_batch_index);
	return SinkNextBatchType::READY;
}